

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O3

CBString * visibleAsciiOrHex(CBString *__return_storage_ptr__,UINT8 *bytes,UINT32 length)

{
  UINT8 *pUVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  UINT8 *pUVar5;
  CBString *b;
  ulong uVar6;
  ulong uVar7;
  CBString hexString;
  CBString asciiString;
  CBString local_78;
  CBString local_60;
  CBString local_48;
  
  Bstrlib::CBString::CBString(&local_60);
  Bstrlib::CBString::CBString(&local_78);
  if (length != 0) {
    uVar7 = (ulong)(length - 1);
    pUVar5 = bytes + 1;
    bVar3 = true;
    uVar6 = 0;
    do {
      usprintf(&local_48,"%02X",(ulong)bytes[uVar6]);
      Bstrlib::CBString::operator+=(&local_78,&local_48);
      Bstrlib::CBString::~CBString(&local_48);
      bVar2 = bytes[uVar6];
      if ((bool)(bVar2 == 0 & uVar6 != 0 & bVar3)) {
        uVar4 = 0;
        do {
          if (uVar7 == uVar4) goto LAB_0014883d;
          pUVar1 = pUVar5 + uVar4;
          uVar4 = uVar4 + 1;
        } while (*pUVar1 == '\0');
        bVar3 = false;
      }
      else {
        if ((byte)(bVar2 + 0x81) < 0xa1) {
          bVar3 = false;
        }
        if (bVar3) {
          usprintf(&local_48,"%c",(ulong)bVar2);
          Bstrlib::CBString::operator+=(&local_60,&local_48);
          Bstrlib::CBString::~CBString(&local_48);
        }
      }
      uVar6 = uVar6 + 1;
      uVar7 = uVar7 - 1;
      pUVar5 = pUVar5 + 1;
    } while (uVar6 != length);
LAB_0014883d:
    b = &local_78;
    if (!bVar3) goto LAB_00148853;
  }
  b = &local_60;
LAB_00148853:
  Bstrlib::CBString::CBString(__return_storage_ptr__,b);
  Bstrlib::CBString::~CBString(&local_78);
  Bstrlib::CBString::~CBString(&local_60);
  return __return_storage_ptr__;
}

Assistant:

UString visibleAsciiOrHex(UINT8* bytes, UINT32 length)
{
    bool ascii = true;
    UString asciiString;
    UString hexString;
    
    for (UINT32 i = 0; i < length; i++) {
        hexString += usprintf("%02X", bytes[i]);
        
        if (ascii && i > 0 && bytes[i] == '\x00') { // Check for the rest of the buffer being zeroes, and make the whole previous string visible, if so
            for (UINT32 j = i + 1; j < length; j++) {
                if (bytes[j] != '\x00') {
                    ascii = false;
                    break;
                }
            }
            
            if (ascii) {
                // No need to continue iterating over every symbol, we did it already
                break;
            }
        }
        else if (bytes[i] < '\x20' || bytes[i] > '\x7E') {  // Explicit ascii codes to avoid locale dependency
            ascii = false;
        }
        
        if (ascii) {
            asciiString += usprintf("%c", bytes[i]);
        }
    }
    
    if (ascii) {
        return asciiString;
    }
    
    return hexString;
}